

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

FloatParts unpack_raw(FloatFmt fmt,uint64_t raw)

{
  uint64_t uVar1;
  uint64_t uVar2;
  FloatParts FVar3;
  
  FVar3.frac = extract64(raw,0,fmt.frac_size);
  uVar1 = extract64(raw,fmt.frac_size,fmt.exp_size);
  uVar2 = extract64(raw,fmt.exp_size + fmt.frac_size,1);
  FVar3._8_8_ = uVar1 & 0xffffffff | (ulong)(uVar2 != 0) << 0x28;
  return FVar3;
}

Assistant:

static inline FloatParts unpack_raw(FloatFmt fmt, uint64_t raw)
{
    const int sign_pos = fmt.frac_size + fmt.exp_size;

    return (FloatParts) {
        .cls = float_class_unclassified,
        .sign = extract64(raw, sign_pos, 1),
        .exp = extract64(raw, fmt.frac_size, fmt.exp_size),
        .frac = extract64(raw, 0, fmt.frac_size),
    };
}